

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo6(Segment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  __type _Var5;
  __type _Var6;
  double dVar7;
  double dVar8;
  double dVar9;
  __type _Var10;
  uint64_t local_108 [24];
  double local_48;
  double m10;
  uint64_t local_38;
  double local_30;
  double m01;
  uint64_t local_20;
  double local_18;
  double m00;
  Segment *this_local;
  
  local_20 = 0;
  m01 = 0.0;
  m00 = (double)this;
  local_18 = getNormalMoment(this,&local_20,(uint64_t *)&m01);
  local_38 = 0;
  m10 = 4.94065645841247e-324;
  local_30 = getNormalMoment(this,&local_38,(uint64_t *)&m10);
  local_108[0x17] = 1;
  local_108[0x16] = 0;
  local_48 = getNormalMoment(this,local_108 + 0x17,local_108 + 0x16);
  local_108[0x15] = 2;
  local_108[0x14] = 0;
  dVar1 = getCentralMoment(this,local_108 + 0x15,local_108 + 0x14,&local_18,&local_48,&local_30);
  local_108[0x13] = 0;
  local_108[0x12] = 2;
  dVar2 = getCentralMoment(this,local_108 + 0x13,local_108 + 0x12,&local_18,&local_48,&local_30);
  local_108[0x11] = 3;
  local_108[0x10] = 0;
  dVar3 = getCentralMoment(this,local_108 + 0x11,local_108 + 0x10,&local_18,&local_48,&local_30);
  local_108[0xf] = 1;
  local_108[0xe] = 2;
  dVar4 = getCentralMoment(this,local_108 + 0xf,local_108 + 0xe,&local_18,&local_48,&local_30);
  _Var5 = std::pow<double,int>(dVar3 + dVar4,2);
  local_108[0xd] = 2;
  local_108[0xc] = 1;
  dVar3 = getCentralMoment(this,local_108 + 0xd,local_108 + 0xc,&local_18,&local_48,&local_30);
  local_108[0xb] = 0;
  local_108[10] = 3;
  dVar4 = getCentralMoment(this,local_108 + 0xb,local_108 + 10,&local_18,&local_48,&local_30);
  _Var6 = std::pow<double,int>(dVar3 + dVar4,2);
  local_108[9] = 1;
  local_108[8] = 1;
  dVar3 = getCentralMoment(this,local_108 + 9,local_108 + 8,&local_18,&local_48,&local_30);
  local_108[7] = 3;
  local_108[6] = 0;
  dVar4 = getCentralMoment(this,local_108 + 7,local_108 + 6,&local_18,&local_48,&local_30);
  local_108[5] = 1;
  local_108[4] = 2;
  dVar7 = getCentralMoment(this,local_108 + 5,local_108 + 4,&local_18,&local_48,&local_30);
  local_108[3] = 2;
  local_108[2] = 1;
  dVar8 = getCentralMoment(this,local_108 + 3,local_108 + 2,&local_18,&local_48,&local_30);
  local_108[1] = 0;
  local_108[0] = 3;
  dVar9 = getCentralMoment(this,local_108 + 1,local_108,&local_18,&local_48,&local_30);
  _Var10 = std::pow<double,int>(local_18,7);
  return ((dVar1 - dVar2) * (_Var5 - _Var6) + dVar3 * 4.0 * (dVar4 + dVar7) * (dVar8 + dVar9)) /
         _Var10;
}

Assistant:

const double
Segment::getHuMomentInvariantNo6()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            (
                (
                    this->getCentralMoment(2, 0, m00, m10, m01) -
                    this->getCentralMoment(0, 2, m00, m10, m01)
                )
                *
                (
                    std::pow(
                        (
                            this->getCentralMoment(3, 0, m00, m10, m01) +
                            this->getCentralMoment(1, 2, m00, m10, m01)
                        ),
                        2
                    )
                    -
                    std::pow(
                        (
                            this->getCentralMoment(2, 1, m00, m10, m01) +
                            this->getCentralMoment(0, 3, m00, m10, m01)
                        ),
                        2
                    )
                )
            )
            +
            (
                (
                    4 *
                    this->getCentralMoment(1, 1, m00, m10, m01)
                )
                *
                (
                    this->getCentralMoment(3, 0, m00, m10, m01) +
                    this->getCentralMoment(1, 2, m00, m10, m01)
                )
                *
                (
                    this->getCentralMoment(2, 1, m00, m10, m01) +
                    this->getCentralMoment(0, 3, m00, m10, m01)
                )
            )
        )
        /
        std::pow(m00, 7)
    );
}